

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepTiledOutputFile::DeepTiledOutputFile
          (DeepTiledOutputFile *this,char *fileName,Header *header,int numThreads)

{
  void *pvVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  Header *in_RDI;
  undefined7 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  OStream *in_stack_00000008;
  Header *in_stack_00000010;
  stringstream _iex_replace_s;
  BaseExc *e;
  undefined1 in_stack_00001a4e;
  undefined1 in_stack_00001a4f;
  Header *in_stack_00001a50;
  OutputStreamMutex *in_stack_fffffffffffffdc0;
  OStream *in_stack_fffffffffffffdc8;
  GenericOutputFile *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffde8;
  StdOFStream *in_stack_fffffffffffffdf0;
  TileOffsets *this_00;
  Data *in_stack_fffffffffffffe40;
  Header *header_00;
  
  header_00 = in_RDI;
  GenericOutputFile::GenericOutputFile((GenericOutputFile *)in_RDI);
  *(undefined ***)&(in_RDI->_map)._M_t._M_impl = &PTR__DeepTiledOutputFile_004c0528;
  this_00 = (TileOffsets *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header;
  pvVar1 = operator_new(0x1d0);
  Data::Data(in_stack_fffffffffffffe40,(int)((ulong)pvVar1 >> 0x20));
  *(void **)this_00 = pvVar1;
  puVar2 = (undefined8 *)operator_new(0x38);
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[6] = 0;
  OutputStreamMutex::OutputStreamMutex(in_stack_fffffffffffffdc0);
  *(undefined8 **)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x1c0) =
       puVar2;
  *(undefined1 *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x1c8) = 1
  ;
  Header::sanityCheck(in_stack_00001a50,(bool)in_stack_00001a4f,(bool)in_stack_00001a4e);
  pvVar1 = operator_new(0x38);
  StdOFStream::StdOFStream(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  *(void **)(*(long *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x1c0
                      ) + 0x28) = pvVar1;
  initialize((DeepTiledOutputFile *)CONCAT17(unaff_retaddr_00,unaff_retaddr),header_00);
  uVar3 = (**(code **)(**(long **)(*(long *)(*(long *)&(in_RDI->_map)._M_t._M_impl.
                                                       super__Rb_tree_header._M_header + 0x1c0) +
                                  0x28) + 0x18))();
  *(undefined8 *)
   (*(long *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x1c0) + 0x30)
       = uVar3;
  GenericOutputFile::writeMagicNumberAndVersionField
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(Header *)in_stack_fffffffffffffdc0
            );
  uVar4 = Header::writeTo(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr_00);
  *(uint64_t *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0xb8) =
       uVar4;
  uVar4 = TileOffsets::writeTo(this_00,(OStream *)in_RDI);
  *(uint64_t *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x150) =
       uVar4;
  *(undefined1 *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x3c) = 0;
  return;
}

Assistant:

DeepTiledOutputFile::DeepTiledOutputFile (
    const char fileName[], const Header& header, int numThreads)
    : _data (new Data (numThreads))

{
    _data->_streamData   = new OutputStreamMutex ();
    _data->_deleteStream = true;
    try
    {
        header.sanityCheck (true);
        _data->_streamData->os = new StdOFStream (fileName);
        initialize (header);
        _data->_streamData->currentPosition = _data->_streamData->os->tellp ();

        // Write header and empty offset table to the file.
        writeMagicNumberAndVersionField (
            *_data->_streamData->os, _data->header);
        _data->previewPosition =
            _data->header.writeTo (*_data->_streamData->os, true);
        _data->tileOffsetsPosition =
            _data->tileOffsets.writeTo (*_data->_streamData->os);
        _data->multipart = false;
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        if (_data && _data->_streamData && _data->_streamData->os)
            delete _data->_streamData->os;
        if (_data && _data->_streamData) delete _data->_streamData;
        if (_data) delete _data;

        REPLACE_EXC (
            e,
            "Cannot open image file "
            "\"" << fileName
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        if (_data && _data->_streamData && _data->_streamData->os)
            delete _data->_streamData->os;
        if (_data->_streamData) delete _data->_streamData;
        if (_data) delete _data;

        throw;
    }
}